

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O1

int __thiscall
ghc::filesystem::basic_ofstream<char,_std::char_traits<char>_>::open
          (basic_ofstream<char,_std::char_traits<char>_> *this,char *__file,int __oflag,...)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RAX;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  string local_38;
  
  path::string_abi_cxx11_(&local_38,(path *)__file);
  std::ofstream::open((char *)this,(_Ios_Openmode)local_38._M_dataplus._M_p);
  paVar1 = &local_38.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != paVar1) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    paVar1 = extraout_RAX;
  }
  return (int)paVar1;
}

Assistant:

void open(const path& p, std::ios_base::openmode mode = std::ios_base::out) { std::basic_ofstream<charT, traits>::open(p.string().c_str(), mode); }